

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

int __thiscall
gl4cts::SparseTexture2LookupTestCase::init(SparseTexture2LookupTestCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  vector<int,_std::allocator<int>_> *this_00;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar1;
  value_type_conflict1 local_e84;
  _Base_ptr local_e80;
  undefined1 local_e78;
  value_type_conflict1 local_e6c;
  _Base_ptr local_e68;
  undefined1 local_e60;
  value_type_conflict1 local_e54;
  _Base_ptr local_e50;
  undefined1 local_e48;
  value_type_conflict1 local_e3c;
  _Base_ptr local_e38;
  undefined1 local_e30;
  value_type_conflict1 local_e24;
  _Base_ptr local_e20;
  undefined1 local_e18;
  value_type_conflict1 local_e0c;
  _Base_ptr local_e08;
  undefined1 local_e00;
  value_type_conflict1 local_df4;
  _Base_ptr local_df0;
  undefined1 local_de8;
  value_type_conflict1 local_de0;
  allocator<char> local_dd9;
  string local_dd8;
  allocator<char> local_db1;
  string local_db0;
  FunctionToken local_d90;
  _Base_ptr local_d20;
  undefined1 local_d18;
  value_type_conflict1 local_d0c;
  _Base_ptr local_d08;
  undefined1 local_d00;
  value_type_conflict1 local_cf4;
  _Base_ptr local_cf0;
  undefined1 local_ce8;
  value_type_conflict1 local_ce0;
  allocator<char> local_cd9;
  string local_cd8;
  allocator<char> local_cb1;
  string local_cb0;
  FunctionToken local_c90;
  _Base_ptr local_c20;
  undefined1 local_c18;
  value_type_conflict1 local_c0c;
  _Base_ptr local_c08;
  undefined1 local_c00;
  value_type_conflict1 local_bf4;
  _Base_ptr local_bf0;
  undefined1 local_be8;
  value_type_conflict1 local_be0;
  allocator<char> local_bd9;
  string local_bd8;
  allocator<char> local_bb1;
  string local_bb0;
  FunctionToken local_b90;
  _Base_ptr local_b20;
  undefined1 local_b18;
  value_type_conflict1 local_b0c;
  _Base_ptr local_b08;
  undefined1 local_b00;
  value_type_conflict1 local_af4;
  _Base_ptr local_af0;
  undefined1 local_ae8;
  value_type_conflict1 local_adc;
  _Base_ptr local_ad8;
  undefined1 local_ad0;
  value_type_conflict1 local_ac4;
  _Base_ptr local_ac0;
  undefined1 local_ab8;
  value_type_conflict1 local_ab0;
  allocator<char> local_aa9;
  string local_aa8;
  allocator<char> local_a81;
  string local_a80;
  FunctionToken local_a60;
  _Base_ptr local_9f0;
  undefined1 local_9e8;
  value_type_conflict1 local_9dc;
  _Base_ptr local_9d8;
  undefined1 local_9d0;
  value_type_conflict1 local_9c4;
  _Base_ptr local_9c0;
  undefined1 local_9b8;
  value_type_conflict1 local_9ac;
  _Base_ptr local_9a8;
  undefined1 local_9a0;
  value_type_conflict1 local_998;
  allocator<char> local_991;
  string local_990;
  allocator<char> local_969;
  string local_968;
  FunctionToken local_948;
  _Base_ptr local_8d8;
  undefined1 local_8d0;
  value_type_conflict1 local_8c4;
  _Base_ptr local_8c0;
  undefined1 local_8b8;
  value_type_conflict1 local_8ac;
  _Base_ptr local_8a8;
  undefined1 local_8a0;
  value_type_conflict1 local_894;
  _Base_ptr local_890;
  undefined1 local_888;
  value_type_conflict1 local_87c;
  _Base_ptr local_878;
  undefined1 local_870;
  value_type_conflict1 local_864;
  _Base_ptr local_860;
  undefined1 local_858;
  value_type_conflict1 local_850;
  allocator<char> local_849;
  string local_848;
  allocator<char> local_821;
  string local_820;
  FunctionToken local_800;
  _Base_ptr local_790;
  undefined1 local_788;
  value_type_conflict1 local_77c;
  _Base_ptr local_778;
  undefined1 local_770;
  value_type_conflict1 local_764;
  _Base_ptr local_760;
  undefined1 local_758;
  value_type_conflict1 local_750;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  FunctionToken local_700;
  _Base_ptr local_690;
  undefined1 local_688;
  value_type_conflict1 local_67c;
  _Base_ptr local_678;
  undefined1 local_670;
  value_type_conflict1 local_664;
  _Base_ptr local_660;
  undefined1 local_658;
  value_type_conflict1 local_64c;
  _Base_ptr local_648;
  undefined1 local_640;
  value_type_conflict1 local_638;
  allocator<char> local_631;
  string local_630;
  allocator<char> local_609;
  string local_608;
  FunctionToken local_5e8;
  _Base_ptr local_578;
  undefined1 local_570;
  value_type_conflict1 local_564;
  _Base_ptr local_560;
  undefined1 local_558;
  value_type_conflict1 local_54c;
  _Base_ptr local_548;
  undefined1 local_540;
  value_type_conflict1 local_534;
  _Base_ptr local_530;
  undefined1 local_528;
  value_type_conflict1 local_51c;
  _Base_ptr local_518;
  undefined1 local_510;
  value_type_conflict1 local_504;
  _Base_ptr local_500;
  undefined1 local_4f8;
  value_type_conflict1 local_4f0;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  FunctionToken local_4a0;
  _Base_ptr local_430;
  undefined1 local_428;
  value_type_conflict1 local_41c;
  _Base_ptr local_418;
  undefined1 local_410;
  value_type_conflict1 local_404;
  _Base_ptr local_400;
  undefined1 local_3f8;
  value_type_conflict1 local_3ec;
  _Base_ptr local_3e8;
  undefined1 local_3e0;
  value_type_conflict1 local_3d8;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  FunctionToken local_388;
  _Base_ptr local_318;
  undefined1 local_310;
  value_type_conflict1 local_304;
  _Base_ptr local_300;
  undefined1 local_2f8;
  value_type_conflict1 local_2ec;
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  value_type_conflict1 local_2d4;
  _Base_ptr local_2d0;
  undefined1 local_2c8;
  value_type_conflict1 local_2bc;
  _Base_ptr local_2b8;
  undefined1 local_2b0;
  value_type_conflict1 local_2a8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  FunctionToken local_258;
  _Base_ptr local_1e8;
  undefined1 local_1e0;
  value_type_conflict1 local_1d4;
  _Base_ptr local_1d0;
  undefined1 local_1c8;
  value_type_conflict1 local_1bc;
  _Base_ptr local_1b8;
  undefined1 local_1b0;
  value_type_conflict1 local_1a4;
  _Base_ptr local_1a0;
  undefined1 local_198;
  value_type_conflict1 local_18c;
  _Base_ptr local_188;
  undefined1 local_180;
  value_type_conflict1 local_174;
  _Base_ptr local_170;
  undefined1 local_168;
  value_type_conflict1 local_160;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_121;
  string local_120;
  FunctionToken local_100;
  undefined1 local_90 [8];
  FunctionToken f;
  value_type_conflict1 local_18;
  value_type_conflict1 local_14;
  SparseTexture2LookupTestCase *local_10;
  SparseTexture2LookupTestCase *this_local;
  
  local_10 = this;
  SparseTextureCommitmentTestCase::init((SparseTextureCommitmentTestCase *)this,ctx);
  this_00 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
             mSupportedTargets;
  local_14 = 0x9100;
  std::vector<int,_std::allocator<int>_>::push_back(this_00,&stack0xffffffffffffffec);
  local_18 = 0x9102;
  std::vector<int,_std::allocator<int>_>::push_back(this_00,&stack0xffffffffffffffe8);
  f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0x81a5;
  std::vector<int,_std::allocator<int>_>::push_back
            (&(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
              mSupportedInternalFormats,
             (value_type_conflict1 *)
             ((long)&f.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  FunctionToken::FunctionToken((FunctionToken *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"sparseTextureARB",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"",&local_159);
  FunctionToken::FunctionToken(&local_100,&local_120,&local_158);
  FunctionToken::operator=((FunctionToken *)local_90,&local_100);
  FunctionToken::~FunctionToken(&local_100);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  local_160 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_160);
  local_170 = (_Base_ptr)pVar1.first._M_node;
  local_168 = pVar1.second;
  local_174 = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_174);
  local_188 = (_Base_ptr)pVar1.first._M_node;
  local_180 = pVar1.second;
  local_18c = 0x8513;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_18c);
  local_1a0 = (_Base_ptr)pVar1.first._M_node;
  local_198 = pVar1.second;
  local_1a4 = 0x9009;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_1a4);
  local_1b8 = (_Base_ptr)pVar1.first._M_node;
  local_1b0 = pVar1.second;
  local_1bc = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_1bc);
  local_1d0 = (_Base_ptr)pVar1.first._M_node;
  local_1c8 = pVar1.second;
  local_1d4 = 0x84f5;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_1d4);
  local_1e8 = (_Base_ptr)pVar1.first._M_node;
  local_1e0 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&this->mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"sparseTextureLodARB",&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,", <LOD>",&local_2a1);
  FunctionToken::FunctionToken(&local_258,&local_278,&local_2a0);
  FunctionToken::operator=((FunctionToken *)local_90,&local_258);
  FunctionToken::~FunctionToken(&local_258);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  local_2a8 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_2a8);
  local_2b8 = (_Base_ptr)pVar1.first._M_node;
  local_2b0 = pVar1.second;
  local_2bc = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_2bc);
  local_2d0 = (_Base_ptr)pVar1.first._M_node;
  local_2c8 = pVar1.second;
  local_2d4 = 0x8513;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_2d4);
  local_2e8 = (_Base_ptr)pVar1.first._M_node;
  local_2e0 = pVar1.second;
  local_2ec = 0x9009;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_2ec);
  local_300 = (_Base_ptr)pVar1.first._M_node;
  local_2f8 = pVar1.second;
  local_304 = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_304);
  local_318 = (_Base_ptr)pVar1.first._M_node;
  local_310 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&this->mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"sparseTextureOffsetARB",&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,", <OFFSET_TYPE><OFFSET_DIM>(0)",&local_3d1);
  FunctionToken::FunctionToken(&local_388,&local_3a8,&local_3d0);
  FunctionToken::operator=((FunctionToken *)local_90,&local_388);
  FunctionToken::~FunctionToken(&local_388);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  local_3d8 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_3d8);
  local_3e8 = (_Base_ptr)pVar1.first._M_node;
  local_3e0 = pVar1.second;
  local_3ec = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_3ec);
  local_400 = (_Base_ptr)pVar1.first._M_node;
  local_3f8 = pVar1.second;
  local_404 = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_404);
  local_418 = (_Base_ptr)pVar1.first._M_node;
  local_410 = pVar1.second;
  local_41c = 0x84f5;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_41c);
  local_430 = (_Base_ptr)pVar1.first._M_node;
  local_428 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&this->mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,"sparseTexelFetchARB",&local_4c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"<LOD_DEF>",&local_4e9);
  FunctionToken::FunctionToken(&local_4a0,&local_4c0,&local_4e8);
  FunctionToken::operator=((FunctionToken *)local_90,&local_4a0);
  FunctionToken::~FunctionToken(&local_4a0);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  local_4f0 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_4f0);
  local_500 = (_Base_ptr)pVar1.first._M_node;
  local_4f8 = pVar1.second;
  local_504 = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_504);
  local_518 = (_Base_ptr)pVar1.first._M_node;
  local_510 = pVar1.second;
  local_51c = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_51c);
  local_530 = (_Base_ptr)pVar1.first._M_node;
  local_528 = pVar1.second;
  local_534 = 0x84f5;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_534);
  local_548 = (_Base_ptr)pVar1.first._M_node;
  local_540 = pVar1.second;
  local_54c = 0x9100;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_54c);
  local_560 = (_Base_ptr)pVar1.first._M_node;
  local_558 = pVar1.second;
  local_564 = 0x9102;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_564);
  local_578 = (_Base_ptr)pVar1.first._M_node;
  local_570 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&this->mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"sparseTexelFetchOffsetARB",&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_630,"<LOD_DEF>, <OFFSET_TYPE><OFFSET_DIM>(0)",&local_631);
  FunctionToken::FunctionToken(&local_5e8,&local_608,&local_630);
  FunctionToken::operator=((FunctionToken *)local_90,&local_5e8);
  FunctionToken::~FunctionToken(&local_5e8);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  local_638 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_638);
  local_648 = (_Base_ptr)pVar1.first._M_node;
  local_640 = pVar1.second;
  local_64c = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_64c);
  local_660 = (_Base_ptr)pVar1.first._M_node;
  local_658 = pVar1.second;
  local_664 = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_664);
  local_678 = (_Base_ptr)pVar1.first._M_node;
  local_670 = pVar1.second;
  local_67c = 0x84f5;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_67c);
  local_690 = (_Base_ptr)pVar1.first._M_node;
  local_688 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&this->mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"sparseTextureLodOffsetARB",&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,", <LOD>, <OFFSET_TYPE><OFFSET_DIM>(0)",&local_749);
  FunctionToken::FunctionToken(&local_700,&local_720,&local_748);
  FunctionToken::operator=((FunctionToken *)local_90,&local_700);
  FunctionToken::~FunctionToken(&local_700);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  local_750 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_750);
  local_760 = (_Base_ptr)pVar1.first._M_node;
  local_758 = pVar1.second;
  local_764 = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_764);
  local_778 = (_Base_ptr)pVar1.first._M_node;
  local_770 = pVar1.second;
  local_77c = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_77c);
  local_790 = (_Base_ptr)pVar1.first._M_node;
  local_788 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&this->mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_820,"sparseTextureGradARB",&local_821);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_848,", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0)",
             &local_849);
  FunctionToken::FunctionToken(&local_800,&local_820,&local_848);
  FunctionToken::operator=((FunctionToken *)local_90,&local_800);
  FunctionToken::~FunctionToken(&local_800);
  std::__cxx11::string::~string((string *)&local_848);
  std::allocator<char>::~allocator(&local_849);
  std::__cxx11::string::~string((string *)&local_820);
  std::allocator<char>::~allocator(&local_821);
  local_850 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_850);
  local_860 = (_Base_ptr)pVar1.first._M_node;
  local_858 = pVar1.second;
  local_864 = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_864);
  local_878 = (_Base_ptr)pVar1.first._M_node;
  local_870 = pVar1.second;
  local_87c = 0x8513;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_87c);
  local_890 = (_Base_ptr)pVar1.first._M_node;
  local_888 = pVar1.second;
  local_894 = 0x9009;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_894);
  local_8a8 = (_Base_ptr)pVar1.first._M_node;
  local_8a0 = pVar1.second;
  local_8ac = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_8ac);
  local_8c0 = (_Base_ptr)pVar1.first._M_node;
  local_8b8 = pVar1.second;
  local_8c4 = 0x84f5;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_8c4);
  local_8d8 = (_Base_ptr)pVar1.first._M_node;
  local_8d0 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&this->mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_968,"sparseTextureGradOffsetARB",&local_969);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_990,
             ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0)"
             ,&local_991);
  FunctionToken::FunctionToken(&local_948,&local_968,&local_990);
  FunctionToken::operator=((FunctionToken *)local_90,&local_948);
  FunctionToken::~FunctionToken(&local_948);
  std::__cxx11::string::~string((string *)&local_990);
  std::allocator<char>::~allocator(&local_991);
  std::__cxx11::string::~string((string *)&local_968);
  std::allocator<char>::~allocator(&local_969);
  local_998 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_998);
  local_9a8 = (_Base_ptr)pVar1.first._M_node;
  local_9a0 = pVar1.second;
  local_9ac = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_9ac);
  local_9c0 = (_Base_ptr)pVar1.first._M_node;
  local_9b8 = pVar1.second;
  local_9c4 = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_9c4);
  local_9d8 = (_Base_ptr)pVar1.first._M_node;
  local_9d0 = pVar1.second;
  local_9dc = 0x84f5;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_9dc);
  local_9f0 = (_Base_ptr)pVar1.first._M_node;
  local_9e8 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&this->mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a80,"sparseTextureGatherARB",&local_a81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_aa8,"<REFZ_DEF>",&local_aa9);
  FunctionToken::FunctionToken(&local_a60,&local_a80,&local_aa8);
  FunctionToken::operator=((FunctionToken *)local_90,&local_a60);
  FunctionToken::~FunctionToken(&local_a60);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::allocator<char>::~allocator(&local_aa9);
  std::__cxx11::string::~string((string *)&local_a80);
  std::allocator<char>::~allocator(&local_a81);
  local_ab0 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_ab0);
  local_ac0 = (_Base_ptr)pVar1.first._M_node;
  local_ab8 = pVar1.second;
  local_ac4 = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_ac4);
  local_ad8 = (_Base_ptr)pVar1.first._M_node;
  local_ad0 = pVar1.second;
  local_adc = 0x8513;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_adc);
  local_af0 = (_Base_ptr)pVar1.first._M_node;
  local_ae8 = pVar1.second;
  local_af4 = 0x9009;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_af4);
  local_b08 = (_Base_ptr)pVar1.first._M_node;
  local_b00 = pVar1.second;
  local_b0c = 0x84f5;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_b0c);
  local_b20 = (_Base_ptr)pVar1.first._M_node;
  local_b18 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&this->mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bb0,"sparseTextureGatherOffsetARB",&local_bb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bd8,"<REFZ_DEF>, <OFFSET_TYPE><OFFSET_DIM>(0)",&local_bd9);
  FunctionToken::FunctionToken(&local_b90,&local_bb0,&local_bd8);
  FunctionToken::operator=((FunctionToken *)local_90,&local_b90);
  FunctionToken::~FunctionToken(&local_b90);
  std::__cxx11::string::~string((string *)&local_bd8);
  std::allocator<char>::~allocator(&local_bd9);
  std::__cxx11::string::~string((string *)&local_bb0);
  std::allocator<char>::~allocator(&local_bb1);
  local_be0 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_be0);
  local_bf0 = (_Base_ptr)pVar1.first._M_node;
  local_be8 = pVar1.second;
  local_bf4 = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_bf4);
  local_c08 = (_Base_ptr)pVar1.first._M_node;
  local_c00 = pVar1.second;
  local_c0c = 0x84f5;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_c0c);
  local_c20 = (_Base_ptr)pVar1.first._M_node;
  local_c18 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&this->mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cb0,"sparseTextureGatherOffsetsARB",&local_cb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cd8,"<REFZ_DEF>, offsetsArray",&local_cd9);
  FunctionToken::FunctionToken(&local_c90,&local_cb0,&local_cd8);
  FunctionToken::operator=((FunctionToken *)local_90,&local_c90);
  FunctionToken::~FunctionToken(&local_c90);
  std::__cxx11::string::~string((string *)&local_cd8);
  std::allocator<char>::~allocator(&local_cd9);
  std::__cxx11::string::~string((string *)&local_cb0);
  std::allocator<char>::~allocator(&local_cb1);
  local_ce0 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_ce0);
  local_cf0 = (_Base_ptr)pVar1.first._M_node;
  local_ce8 = pVar1.second;
  local_cf4 = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_cf4);
  local_d08 = (_Base_ptr)pVar1.first._M_node;
  local_d00 = pVar1.second;
  local_d0c = 0x84f5;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_d0c);
  local_d20 = (_Base_ptr)pVar1.first._M_node;
  local_d18 = pVar1.second;
  std::
  vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
  ::push_back(&this->mFunctions,(value_type *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_db0,"sparseImageLoadARB",&local_db1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_dd8,"",&local_dd9);
  FunctionToken::FunctionToken(&local_d90,&local_db0,&local_dd8);
  FunctionToken::operator=((FunctionToken *)local_90,&local_d90);
  FunctionToken::~FunctionToken(&local_d90);
  std::__cxx11::string::~string((string *)&local_dd8);
  std::allocator<char>::~allocator(&local_dd9);
  std::__cxx11::string::~string((string *)&local_db0);
  std::allocator<char>::~allocator(&local_db1);
  local_de0 = 0xde1;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_de0);
  local_df0 = (_Base_ptr)pVar1.first._M_node;
  local_de8 = pVar1.second;
  local_df4 = 0x8c1a;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_df4);
  local_e08 = (_Base_ptr)pVar1.first._M_node;
  local_e00 = pVar1.second;
  local_e0c = 0x8513;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_e0c);
  local_e20 = (_Base_ptr)pVar1.first._M_node;
  local_e18 = pVar1.second;
  local_e24 = 0x9009;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_e24);
  local_e38 = (_Base_ptr)pVar1.first._M_node;
  local_e30 = pVar1.second;
  local_e3c = 0x806f;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_e3c);
  local_e50 = (_Base_ptr)pVar1.first._M_node;
  local_e48 = pVar1.second;
  local_e54 = 0x84f5;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_e54);
  local_e68 = (_Base_ptr)pVar1.first._M_node;
  local_e60 = pVar1.second;
  local_e6c = 0x9100;
  pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     ((long)&f.arguments.field_2 + 8),&local_e6c);
  local_e80 = (_Base_ptr)pVar1.first._M_node;
  local_e78 = pVar1.second;
  local_e84 = 0x9102;
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
            ((set<int,_std::less<int>,_std::allocator<int>_> *)((long)&f.arguments.field_2 + 8),
             &local_e84);
  FunctionToken::~FunctionToken((FunctionToken *)local_90);
  return extraout_EAX;
}

Assistant:

void SparseTexture2LookupTestCase::init()
{
	SparseTextureCommitmentTestCase::init();
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

	mSupportedInternalFormats.push_back(GL_DEPTH_COMPONENT16);

	FunctionToken f;
	f = FunctionToken("sparseTextureARB", "");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureLodARB", ", <LOD>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureOffsetARB", ", <OFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTexelFetchARB", "<LOD_DEF>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	f.allowedTargets.insert(GL_TEXTURE_2D_MULTISAMPLE);
	f.allowedTargets.insert(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTexelFetchOffsetARB", "<LOD_DEF>, <OFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureLodOffsetARB", ", <LOD>, <OFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGradARB", ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGradOffsetARB",
					  ", <NOFFSET_TYPE><OFFSET_DIM>(0), <NOFFSET_TYPE><OFFSET_DIM>(0), <OFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGatherARB", "<REFZ_DEF>");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGatherOffsetARB", "<REFZ_DEF>, <OFFSET_TYPE><OFFSET_DIM>(0)");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseTextureGatherOffsetsARB", "<REFZ_DEF>, offsetsArray");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	mFunctions.push_back(f);

	f = FunctionToken("sparseImageLoadARB", "");
	f.allowedTargets.insert(GL_TEXTURE_2D);
	f.allowedTargets.insert(GL_TEXTURE_2D_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP);
	f.allowedTargets.insert(GL_TEXTURE_CUBE_MAP_ARRAY);
	f.allowedTargets.insert(GL_TEXTURE_3D);
	f.allowedTargets.insert(GL_TEXTURE_RECTANGLE);
	f.allowedTargets.insert(GL_TEXTURE_2D_MULTISAMPLE);
	f.allowedTargets.insert(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
	//mFunctions.push_back(f);
}